

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void QMetaObjectPrivate::memberIndexes
               (QObject *obj,QMetaMethod *member,int *signalIndex,int *methodIndex)

{
  int iVar1;
  MethodType MVar2;
  undefined4 extraout_var;
  long in_FS_OFFSET;
  int methodOffset;
  int signalOffset;
  long local_30;
  QMetaObject *metaobject;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  *signalIndex = -1;
  *methodIndex = -1;
  if ((obj != (QObject *)0x0) && (member->mobj != (QMetaObject *)0x0)) {
    iVar1 = (**obj->_vptr_QObject)();
    for (metaobject = (QMetaObject *)CONCAT44(extraout_var,iVar1);
        (metaobject != (QMetaObject *)0x0 && (metaobject != member->mobj));
        metaobject = (metaobject->d).superdata.direct) {
    }
    if (metaobject != (QMetaObject *)0x0) {
      iVar1 = QMetaMethod::relativeMethodIndex(member);
      *methodIndex = iVar1;
      *signalIndex = iVar1;
      signalOffset = -0x55555556;
      methodOffset = -0x55555556;
      computeOffsets(metaobject,&signalOffset,&methodOffset);
      *methodIndex = *methodIndex + methodOffset;
      MVar2 = QMetaMethod::methodType(member);
      if (MVar2 == Signal) {
        iVar1 = originalClone(metaobject,*signalIndex);
        iVar1 = iVar1 + signalOffset;
      }
      else {
        iVar1 = -1;
      }
      *signalIndex = iVar1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMetaObjectPrivate::memberIndexes(const QObject *obj,
                                       const QMetaMethod &member,
                                       int *signalIndex, int *methodIndex)
{
    *signalIndex = -1;
    *methodIndex = -1;
    if (!obj || !member.mobj)
        return;
    const QMetaObject *m = obj->metaObject();
    // Check that member is member of obj class
    while (m != nullptr && m != member.mobj)
        m = m->d.superdata;
    if (!m)
        return;
    *signalIndex = *methodIndex = member.relativeMethodIndex();

    int signalOffset;
    int methodOffset;
    computeOffsets(m, &signalOffset, &methodOffset);

    *methodIndex += methodOffset;
    if (member.methodType() == QMetaMethod::Signal) {
        *signalIndex = originalClone(m, *signalIndex);
        *signalIndex += signalOffset;
    } else {
        *signalIndex = -1;
    }
}